

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::get_common_basic_type
          (Compiler *this,SPIRType *type,BaseType *base_type)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type_00;
  BaseType local_4c;
  TypedID<(diligent_spirv_cross::Types)1> *pTStack_48;
  BaseType member_base;
  TypedID<(diligent_spirv_cross::Types)1> *member_type;
  TypedID<(diligent_spirv_cross::Types)1> *__end2;
  TypedID<(diligent_spirv_cross::Types)1> *__begin2;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL> *__range2;
  BaseType *base_type_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  if (type->basetype == Struct) {
    *base_type = Unknown;
    __begin2 = (TypedID<(diligent_spirv_cross::Types)1> *)&type->member_types;
    __range2 = (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,_8UL> *)
               base_type;
    base_type_local = (BaseType *)type;
    type_local = (SPIRType *)this;
    __end2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::begin
                       ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                         *)__begin2);
    member_type = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::end
                            ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                              *)__begin2);
    for (; __end2 != member_type; __end2 = __end2 + 1) {
      pTStack_48 = __end2;
      id = TypedID::operator_cast_to_unsigned_int((TypedID *)__end2);
      type_00 = get<diligent_spirv_cross::SPIRType>(this,id);
      bVar1 = get_common_basic_type(this,type_00,&local_4c);
      if (!bVar1) {
        return false;
      }
      if (*(int *)&(__range2->
                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>)
                   .ptr == 0) {
        *(BaseType *)
         &(__range2->
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>).ptr =
             local_4c;
      }
      else if (*(BaseType *)
                &(__range2->
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>).
                 ptr != local_4c) {
        return false;
      }
    }
  }
  else {
    *base_type = type->basetype;
  }
  return true;
}

Assistant:

bool Compiler::get_common_basic_type(const SPIRType &type, SPIRType::BaseType &base_type)
{
	if (type.basetype == SPIRType::Struct)
	{
		base_type = SPIRType::Unknown;
		for (auto &member_type : type.member_types)
		{
			SPIRType::BaseType member_base;
			if (!get_common_basic_type(get<SPIRType>(member_type), member_base))
				return false;

			if (base_type == SPIRType::Unknown)
				base_type = member_base;
			else if (base_type != member_base)
				return false;
		}
		return true;
	}
	else
	{
		base_type = type.basetype;
		return true;
	}
}